

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O2

int increment_state(void)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = sem_wait((sem_t *)write_sem);
  if (iVar1 == 0) {
    buf->state = buf->state + 1;
    iVar1 = sem_post((sem_t *)write_sem);
    if (iVar1 == 0) {
      return 0;
    }
  }
  piVar2 = __errno_location();
  return (uint)(*piVar2 == 4) * 2 + -1;
}

Assistant:

int increment_state()
{
    if (sem_wait(write_sem) != 0)
    {
        if(errno==EINTR)
            return 1;
        else
            return -1;
    }
    buf->state++;
    if (sem_post(write_sem) != 0)
    {
        if(errno==EINTR)
            return 1;
        else
            return -1;
    }
    return 0;
}